

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

void anon_unknown.dwarf_17105::loadMonitor(Monitor *out,Value *v)

{
  bool bVar1;
  reference this;
  return_type pbVar2;
  string *in_RDI;
  Value *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *table;
  string *in_stack_00000180;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *in_stack_ffffffffffffffb8;
  Value *in_stack_ffffffffffffffc0;
  _Self local_30;
  _Self local_28;
  return_type local_20;
  return_type local_18;
  string *local_8;
  
  local_8 = in_RDI;
  local_20 = toml::Value::
             as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                       (in_stack_ffffffffffffffc0);
  local_18 = local_20;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    this = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
           ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
                        *)0x17bfc4);
    bVar1 = std::operator==(&this->first,(char *)&this->second);
    if (bVar1) {
      pbVar2 = toml::Value::as<std::__cxx11::string>((Value *)this);
      std::__cxx11::string::operator=(local_8,(string *)pbVar2);
    }
    else {
      throwInvalidKey(in_stack_00000180);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
                  *)this);
  }
  return;
}

Assistant:

void loadMonitor(Config::Monitor& out, const toml::Value& v) {
  const auto& table = v.as<toml::Table>();
  for (const auto& it : table) {
    const auto& key = it.first;
    const auto& value = it.second;

    if (key == "statsd_address") {
      out.statsdAddress = value.as<std::string>();
      continue;
    }

    throwInvalidKey(key);
  }
}